

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O0

token * dmrC_assignment_expression(dmr_C *C,token *token,expression **tree)

{
  uint uVar1;
  token *ptVar2;
  expression *peVar3;
  expression *expr;
  int op;
  int i;
  expression **tree_local;
  token *token_local;
  dmr_C *C_local;
  
  ptVar2 = dmrC_conditional_expression(C,token,tree);
  if ((*tree != (expression *)0x0) && ((SUB84(ptVar2->pos,0) & 0x3f) == 0x11)) {
    uVar1 = (ptVar2->field_2).special;
    for (expr._4_4_ = 0; expr._4_4_ < 0xb; expr._4_4_ = expr._4_4_ + 1) {
      if (dmrC_assignment_expression::assignments[expr._4_4_] == uVar1) {
        peVar3 = dmrC_alloc_expression(C,ptVar2->pos,6);
        (peVar3->field_5).field_3.unop = *tree;
        peVar3->op = uVar1;
        *tree = peVar3;
        ptVar2 = dmrC_assignment_expression(C,ptVar2->next,&(peVar3->field_5).field_6.right);
        return ptVar2;
      }
    }
  }
  return ptVar2;
}

Assistant:

struct token *dmrC_assignment_expression(struct dmr_C *C, struct token *token, struct expression **tree)
{
	token = dmrC_conditional_expression(C, token, tree);
	if (*tree && dmrC_token_type(token) == TOKEN_SPECIAL) {
		static const int assignments[] = {
			'=',
			SPECIAL_ADD_ASSIGN, SPECIAL_SUB_ASSIGN,
			SPECIAL_MUL_ASSIGN, SPECIAL_DIV_ASSIGN,
			SPECIAL_MOD_ASSIGN, SPECIAL_SHL_ASSIGN,
			SPECIAL_SHR_ASSIGN, SPECIAL_AND_ASSIGN,
			SPECIAL_OR_ASSIGN,  SPECIAL_XOR_ASSIGN };
		int i, op = token->special;
		for (i = 0; i < (int)ARRAY_SIZE(assignments); i++)
			if (assignments[i] == op) {
				struct expression * expr = dmrC_alloc_expression(C, token->pos, EXPR_ASSIGNMENT);
				expr->left = *tree;
				expr->op = op;
				*tree = expr;
				return dmrC_assignment_expression(C, token->next, &expr->right);
			}
	}
	return token;
}